

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O2

void de::BlockBufferCancelTest::runTest(void)

{
  uint uVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  uint uVar4;
  Consumer *this;
  Producer *this_00;
  int iVar5;
  pointer ppTVar6;
  bool bVar7;
  vector<de::Thread_*,_std::allocator<de::Thread_*>_> threads;
  Consumer *local_98;
  Random rnd;
  BlockBuffer<unsigned_char> buffer;
  
  BlockBuffer<unsigned_char>::BlockBuffer(&buffer,0x40,0x10);
  for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
    uVar1 = (uVar4 ^ 0x3d) * 9;
    uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
    deRandom_init(&rnd.m_rnd,uVar1 >> 0xf ^ uVar1);
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar5 = (dVar2 & 0xf) + 1;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1,
          ppTVar6 = threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
                    super__Vector_impl_data._M_start, bVar7) {
      bVar7 = Random::getBool((Random *)&rnd.m_rnd);
      if (bVar7) {
        this = (Consumer *)operator_new(0x28);
        dVar2 = deRandom_getUint32(&rnd.m_rnd);
        Consumer::Consumer(this,&buffer,dVar2);
        local_98 = this;
        std::vector<de::Thread*,std::allocator<de::Thread*>>::emplace_back<de::Thread*>
                  ((vector<de::Thread*,std::allocator<de::Thread*>> *)&threads,(Thread **)&local_98)
        ;
      }
      else {
        this_00 = (Producer *)operator_new(0x28);
        dVar2 = deRandom_getUint32(&rnd.m_rnd);
        Producer::Producer(this_00,&buffer,dVar2);
        local_98 = (Consumer *)this_00;
        std::vector<de::Thread*,std::allocator<de::Thread*>>::emplace_back<de::Thread*>
                  ((vector<de::Thread*,std::allocator<de::Thread*>> *)&threads,(Thread **)&local_98)
        ;
      }
    }
    for (; ppTVar6 !=
           threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
           super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
      Thread::start(*ppTVar6);
    }
    deSleep(dVar3 % 200 + 1);
    BlockBuffer<unsigned_char>::cancel(&buffer);
    for (ppTVar6 = threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppTVar6 !=
        threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
      Thread::join(*ppTVar6);
    }
    BlockBuffer<unsigned_char>::clear(&buffer);
    for (ppTVar6 = threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppTVar6 !=
        threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
      if (*ppTVar6 != (Thread *)0x0) {
        (*(*ppTVar6)->_vptr_Thread[1])();
      }
    }
    std::_Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>::~_Vector_base
              ((_Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_> *)&threads);
  }
  BlockBuffer<unsigned_char>::~BlockBuffer(&buffer);
  return;
}

Assistant:

void runTest (void)
{
	BlockBuffer<deUint8>	buffer			(64, 16);
	const int				numIterations	= 8;

	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		Random				rnd				(deInt32Hash(iterNdx));
		int					numThreads		= rnd.getInt(1, 16);
		int					sleepMs			= rnd.getInt(1, 200);
		vector<Thread*>		threads;

		for (int i = 0; i < numThreads; i++)
		{
			if (rnd.getBool())
				threads.push_back(new Consumer(&buffer, rnd.getUint32()));
			else
				threads.push_back(new Producer(&buffer, rnd.getUint32()));
		}

		// Start threads.
		for (vector<Thread*>::iterator i = threads.begin(); i != threads.end(); i++)
			(*i)->start();

		// Sleep for a while.
		deSleep(sleepMs);

		// Cancel buffer.
		buffer.cancel();

		// Wait for threads to finish.
		for (vector<Thread*>::iterator i = threads.begin(); i != threads.end(); i++)
			(*i)->join();

		// Reset buffer.
		buffer.clear();

		// Delete threads
		for (vector<Thread*>::iterator thread = threads.begin(); thread != threads.end(); ++thread)
			delete *thread;
	}
}